

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# insertproxymodel.cpp
# Opt level: O2

void __thiscall
InsertProxyModelPrivate::checkExtraDataChanged
          (InsertProxyModelPrivate *this,QModelIndex *topLeft,QModelIndex *bottomRight,
          QVector<int> *roles)

{
  InsertProxyModel *pIVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  int iVar5;
  long *plVar6;
  QModelIndex mappedParent;
  QModelIndex local_60;
  undefined1 local_48 [24];
  
  pIVar1 = this->q_ptr;
  QModelIndex::parent(&local_60,topLeft);
  (**(code **)(*(long *)pIVar1 + 400))(local_48,pIVar1,&local_60);
  plVar6 = (long *)QAbstractProxyModel::sourceModel();
  iVar4 = (**(code **)(*plVar6 + 0x80))(plVar6,local_48);
  plVar6 = (long *)QAbstractProxyModel::sourceModel();
  iVar5 = (**(code **)(*plVar6 + 0x78))(plVar6,local_48);
  bVar2 = QModelIndex::operator==(topLeft,bottomRight);
  if (((!bVar2) || (bottomRight->c < iVar4)) || (bottomRight->r < iVar5)) {
    if (bottomRight->c < iVar4) {
      if (iVar5 <= bottomRight->r) {
        cVar3 = (**(code **)(*(long *)pIVar1 + 0x1c0))(pIVar1);
        if (cVar3 != '\0') {
          commitRow(this);
        }
      }
    }
    else {
      cVar3 = (**(code **)(*(long *)pIVar1 + 0x1c8))(pIVar1);
      if (cVar3 != '\0') {
        commitColumn(this);
      }
    }
  }
  return;
}

Assistant:

void InsertProxyModelPrivate::checkExtraDataChanged(const QModelIndex &topLeft, const QModelIndex &bottomRight, const QVector<int> &roles)
{
    Q_UNUSED(roles)
    Q_ASSERT(topLeft.isValid());
    Q_ASSERT(bottomRight.isValid());
    Q_Q(InsertProxyModel);
    Q_ASSERT(topLeft.model() == q);
    Q_ASSERT(bottomRight.model() == q);
    Q_ASSERT(topLeft.row() <= bottomRight.row());
    Q_ASSERT(topLeft.column() <= bottomRight.column());
    Q_ASSERT(topLeft.parent() == bottomRight.parent());
    const QModelIndex mappedParent = q->mapToSource(topLeft.parent());
    const int sourceCols = q->sourceModel()->columnCount(mappedParent);
    const int sourceRows = q->sourceModel()->rowCount(mappedParent);
    if (topLeft == bottomRight && bottomRight.column() >= sourceCols && bottomRight.row() >= sourceRows)
        return; // the corner changed
    if (bottomRight.column() >= sourceCols) {
        if (q->validColumn())
            commitColumn();
    } else if (bottomRight.row() >= sourceRows) {
        if (q->validRow())
            commitRow();
    }
}